

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Functional.cpp
# Opt level: O0

void __thiscall Functional::make_k(Functional *this,int k)

{
  size_type sVar1;
  int k_local;
  Functional *this_local;
  
  Field::operator=(&(this->kmean_search).f,&this->f);
  sVar1 = std::vector<Point,_std::allocator<Point>_>::size(&(this->f).all_points);
  (this->kmean_search).points_nmb = (int)sVar1;
  (this->kmean_search).k = k;
  Kmean::k_mean(&this->kmean_search);
  std::
  vector<std::vector<Cluster,_std::allocator<Cluster>_>,_std::allocator<std::vector<Cluster,_std::allocator<Cluster>_>_>_>
  ::push_back(&this->searches,&(this->kmean_search).clusters);
  return;
}

Assistant:

void Functional::make_k(int k) {

    kmean_search.f = f;
    kmean_search.points_nmb = (int) f.all_points.size();
    kmean_search.k = k;
    kmean_search.k_mean();
    searches.push_back(kmean_search.clusters);

}